

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *wrk,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  long lVar11;
  byte bVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<200U,_int,_void> local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  long local_b8;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar12 = 0;
  lVar4 = (long)this->thedim;
  local_c0 = wrk;
  if (0 < lVar4) {
    do {
      iVar2 = (this->row).orig[lVar4 + -1];
      iVar1 = (this->col).orig[lVar4 + -1];
      pcVar7 = &vec[iVar2].m_backend;
      pcVar10 = &(this->diag).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x1c;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems[0xe] = 0;
      local_148.data._M_elems[0xf] = 0;
      local_148.data._M_elems[0x10] = 0;
      local_148.data._M_elems[0x11] = 0;
      local_148.data._M_elems[0x12] = 0;
      local_148.data._M_elems[0x13] = 0;
      local_148.data._M_elems[0x14] = 0;
      local_148.data._M_elems[0x15] = 0;
      local_148.data._M_elems[0x16] = 0;
      local_148.data._M_elems[0x17] = 0;
      local_148.data._M_elems[0x18] = 0;
      local_148.data._M_elems[0x19] = 0;
      local_148.data._M_elems._104_5_ = 0;
      local_148.data._M_elems[0x1b]._1_3_ = 0;
      local_148.exp = 0;
      local_148.neg = false;
      pcVar6 = pcVar10;
      local_b8 = lVar4;
      if ((&local_148 != pcVar7) && (pcVar6 = pcVar7, &local_148 != pcVar10)) {
        pcVar5 = pcVar10;
        pcVar8 = &local_148;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(uint *)pcVar8 = (pcVar5->data)._M_elems[0];
          pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + (ulong)bVar12 * -8 + 4);
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar12 * -2 + 1) * 4);
        }
        local_148.exp = pcVar10->exp;
        local_148.neg = pcVar10->neg;
        local_148.fpclass = pcVar10->fpclass;
        local_148.prec_elem = pcVar10->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_148,pcVar6)
      ;
      pcVar6 = &local_148;
      pnVar9 = local_c0 + iVar1;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = *(uint *)pcVar6;
        pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar12 * -2 + 1) * 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
      }
      local_c0[iVar1].m_backend.exp = local_148.exp;
      local_c0[iVar1].m_backend.neg = local_148.neg;
      local_c0[iVar1].m_backend.fpclass = local_148.fpclass;
      local_c0[iVar1].m_backend.prec_elem = local_148.prec_elem;
      pcVar6 = &local_148;
      pcVar10 = &local_b0;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar10->data)._M_elems[0] = *(uint *)pcVar6;
        pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar12 * -2 + 1) * 4);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + ((ulong)bVar12 * -2 + 1) * 4);
      }
      local_b0.exp = local_148.exp;
      local_b0.neg = local_148.neg;
      local_b0.fpclass = local_148.fpclass;
      local_b0.prec_elem = local_148.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)pcVar7,0.0);
      if (local_b0.fpclass == cpp_dec_float_NaN) {
LAB_0053321c:
        if (0 < (this->u).col.len[iVar1]) {
          lVar4 = (long)(this->u).col.start[iVar1];
          lVar11 = lVar4 << 7;
          do {
            pcVar6 = (cpp_dec_float<200U,_int,_void> *)
                     ((long)(((this->u).col.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar11);
            local_148.fpclass = cpp_dec_float_finite;
            local_148.prec_elem = 0x1c;
            local_148.data._M_elems[0] = 0;
            local_148.data._M_elems[1] = 0;
            local_148.data._M_elems[2] = 0;
            local_148.data._M_elems[3] = 0;
            local_148.data._M_elems[4] = 0;
            local_148.data._M_elems[5] = 0;
            local_148.data._M_elems[6] = 0;
            local_148.data._M_elems[7] = 0;
            local_148.data._M_elems[8] = 0;
            local_148.data._M_elems[9] = 0;
            local_148.data._M_elems[10] = 0;
            local_148.data._M_elems[0xb] = 0;
            local_148.data._M_elems[0xc] = 0;
            local_148.data._M_elems[0xd] = 0;
            local_148.data._M_elems[0xe] = 0;
            local_148.data._M_elems[0xf] = 0;
            local_148.data._M_elems[0x10] = 0;
            local_148.data._M_elems[0x11] = 0;
            local_148.data._M_elems[0x12] = 0;
            local_148.data._M_elems[0x13] = 0;
            local_148.data._M_elems[0x14] = 0;
            local_148.data._M_elems[0x15] = 0;
            local_148.data._M_elems[0x16] = 0;
            local_148.data._M_elems[0x17] = 0;
            local_148.data._M_elems[0x18] = 0;
            local_148.data._M_elems[0x19] = 0;
            local_148.data._M_elems._104_5_ = 0;
            local_148.data._M_elems[0x1b]._1_3_ = 0;
            local_148.exp = 0;
            local_148.neg = false;
            pcVar7 = &local_b0;
            if (pcVar6 != &local_148) {
              pcVar10 = &local_148;
              for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
                *(uint *)pcVar10 = (pcVar7->data)._M_elems[0];
                pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar12 * -8 + 4);
                pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar10 + ((ulong)bVar12 * -2 + 1) * 4);
              }
              local_148.exp = local_b0.exp;
              local_148.neg = local_b0.neg;
              local_148.prec_elem = local_b0.prec_elem;
              local_148.fpclass = local_b0.fpclass;
              pcVar7 = pcVar6;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_148,pcVar7);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&vec[(this->u).col.idx[lVar4]].m_backend,&local_148);
            lVar4 = lVar4 + 1;
            lVar11 = lVar11 + 0x80;
          } while (lVar4 < (long)(this->u).col.len[iVar1] + (long)(this->u).col.start[iVar1]);
        }
      }
      else {
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 0x1c;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems[6] = 0;
        local_148.data._M_elems[7] = 0;
        local_148.data._M_elems[8] = 0;
        local_148.data._M_elems[9] = 0;
        local_148.data._M_elems[10] = 0;
        local_148.data._M_elems[0xb] = 0;
        local_148.data._M_elems[0xc] = 0;
        local_148.data._M_elems[0xd] = 0;
        local_148.data._M_elems[0xe] = 0;
        local_148.data._M_elems[0xf] = 0;
        local_148.data._M_elems[0x10] = 0;
        local_148.data._M_elems[0x11] = 0;
        local_148.data._M_elems[0x12] = 0;
        local_148.data._M_elems[0x13] = 0;
        local_148.data._M_elems[0x14] = 0;
        local_148.data._M_elems[0x15] = 0;
        local_148.data._M_elems[0x16] = 0;
        local_148.data._M_elems[0x17] = 0;
        local_148.data._M_elems[0x18] = 0;
        local_148.data._M_elems[0x19] = 0;
        local_148.data._M_elems._104_5_ = 0;
        local_148.data._M_elems[0x1b]._1_3_ = 0;
        local_148.exp = 0;
        local_148.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_148,0.0);
        iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&local_148);
        if (iVar2 != 0) goto LAB_0053321c;
      }
      lVar4 = local_b8 + -1;
    } while (1 < local_b8);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUright(R* wrk, R* vec) const
{

   for(int i = thedim - 1; i >= 0; i--)
   {
      int  r = row.orig[i];
      int  c = col.orig[i];
      R x = wrk[c] = diag[r] * vec[r];

      vec[r] = 0.0;

      if(x != 0.0)
         //if (isNotZero(x))
      {
         for(int j = u.col.start[c]; j < u.col.start[c] + u.col.len[c]; j++)
            vec[u.col.idx[j]] -= x * u.col.val[j];
      }
   }
}